

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomprops.c
# Opt level: O0

float getExplRad(int a)

{
  float local_c;
  int a_local;
  
  if (NuclearRadii == 0) {
    local_c = AtomTblIndex[a]->eRad;
  }
  else {
    local_c = AtomTblIndex[a]->eRad_nuc;
  }
  return local_c;
}

Assistant:

float getExplRad(int a)  {
  if (NuclearRadii) {
    /*if ( (strcmp(AtomTblIndex[a]->name, "H")    == 0) ||
         (strcmp(AtomTblIndex[a]->name, "Har")  == 0) ||
         (strcmp(AtomTblIndex[a]->name, "Hpol") == 0) ||
         (strcmp(AtomTblIndex[a]->name, "HOd")  == 0) ) {
      return ( (AtomTblIndex[a]->eRad - 0.05) );
    }*/
    return AtomTblIndex[a]->eRad_nuc;
  }
  else {
    return AtomTblIndex[a]->eRad;
  }
}